

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conncache.c
# Opt level: O3

void Curl_conncache_close_all_connections(conncache *connc)

{
  uint uVar1;
  uint uVar2;
  Curl_easy *pCVar3;
  connectdata *conn;
  sigpipe_ignore pipe_st;
  sigpipe_ignore sStack_b8;
  
  conn = Curl_conncache_find_first_connection(connc);
  while (conn != (connectdata *)0x0) {
    pCVar3 = connc->closure_handle;
    conn->data = pCVar3;
    uVar1._0_1_ = (pCVar3->set).no_signal;
    uVar1._1_1_ = (pCVar3->set).global_dns_cache;
    uVar1._2_1_ = (pCVar3->set).tcp_nodelay;
    uVar1._3_1_ = (pCVar3->set).ignorecl;
    sigpipe_ignore((Curl_easy *)(ulong)uVar1,&sStack_b8);
    conn->data->easy_conn = (connectdata *)0x0;
    Curl_conncontrol(conn,1);
    Curl_disconnect(connc->closure_handle,conn,false);
    if (sStack_b8.no_signal == false) {
      sigaction(0xd,(sigaction *)&sStack_b8,(sigaction *)0x0);
    }
    conn = Curl_conncache_find_first_connection(connc);
  }
  pCVar3 = connc->closure_handle;
  if (pCVar3 != (Curl_easy *)0x0) {
    uVar2._0_1_ = (pCVar3->set).no_signal;
    uVar2._1_1_ = (pCVar3->set).global_dns_cache;
    uVar2._2_1_ = (pCVar3->set).tcp_nodelay;
    uVar2._3_1_ = (pCVar3->set).ignorecl;
    sigpipe_ignore((Curl_easy *)(ulong)uVar2,&sStack_b8);
    Curl_hostcache_clean(connc->closure_handle,(connc->closure_handle->dns).hostcache);
    Curl_close(connc->closure_handle);
    if (sStack_b8.no_signal == false) {
      sigaction(0xd,(sigaction *)&sStack_b8,(sigaction *)0x0);
    }
  }
  return;
}

Assistant:

void Curl_conncache_close_all_connections(struct conncache *connc)
{
  struct connectdata *conn;

  conn = Curl_conncache_find_first_connection(connc);
  while(conn) {
    SIGPIPE_VARIABLE(pipe_st);
    conn->data = connc->closure_handle;

    sigpipe_ignore(conn->data, &pipe_st);
    conn->data->easy_conn = NULL; /* clear the easy handle's connection
                                     pointer */
    /* This will remove the connection from the cache */
    connclose(conn, "kill all");
    (void)Curl_disconnect(connc->closure_handle, conn, FALSE);
    sigpipe_restore(&pipe_st);

    conn = Curl_conncache_find_first_connection(connc);
  }

  if(connc->closure_handle) {
    SIGPIPE_VARIABLE(pipe_st);
    sigpipe_ignore(connc->closure_handle, &pipe_st);

    Curl_hostcache_clean(connc->closure_handle,
                         connc->closure_handle->dns.hostcache);
    Curl_close(connc->closure_handle);
    sigpipe_restore(&pipe_st);
  }
}